

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_loaded_list.h
# Opt level: O0

loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>_>
* __thiscall
omp::make_loaded_list<(anonymous_namespace)::IIntegerManager,std::vector<int,std::allocator<int>>>
          (loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,_long,_(anonymous_namespace)::Integer>_>
           *__return_storage_ptr__,omp *this,
          shared_ptr<(anonymous_namespace)::IIntegerManager> *list,
          vector<int,_std::allocator<int>_> *args)

{
  element_type *peVar1;
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *args_local;
  shared_ptr<(anonymous_namespace)::IIntegerManager> *list_local;
  
  local_20 = (vector<int,_std::allocator<int>_> *)list;
  args_local = (vector<int,_std::allocator<int>_> *)this;
  list_local = (shared_ptr<(anonymous_namespace)::IIntegerManager> *)__return_storage_ptr__;
  peVar1 = std::
           __shared_ptr_access<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<(anonymous_namespace)::IIntegerManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::vector<int,_std::allocator<int>_>::vector(&local_38,local_20);
  (**peVar1->_vptr_IIntegerManager)(peVar1,&local_38);
  std::vector<int,_std::allocator<int>_>::~vector(&local_38);
  loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,long,(anonymous_namespace)::Integer>>
  ::loaded_list_wrapper<std::shared_ptr<(anonymous_namespace)::IIntegerManager>>
            ((loaded_list_wrapper<omp::shared_ptr_wrapper<(anonymous_namespace)::IIntegerManager,long,(anonymous_namespace)::Integer>>
              *)__return_storage_ptr__,
             (shared_ptr<(anonymous_namespace)::IIntegerManager> *)args_local);
  return __return_storage_ptr__;
}

Assistant:

auto make_loaded_list(const std::shared_ptr<T> &list, Args &&...args) {
  using record_by_index = get_record_by_index_<decltype(&T::GetRecordByIndex)>;

  using value_type =
      std::remove_pointer_t<typename record_by_index::value_type>;

  list->LoadDataList(std::forward<Args>(args)...);

  return loaded_list_wrapper<
      shared_ptr_wrapper<T, typename record_by_index::index_type, value_type>>(
      list);
}